

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::CheckerVisitor::checkFormatArguments(CheckerVisitor *this,CallExpr *call)

{
  uint uVar1;
  Expr **ppEVar2;
  undefined8 *puVar3;
  long *plVar4;
  uint uVar5;
  int iVar6;
  Expr *pEVar7;
  SQChar *__s;
  char *pcVar8;
  _func_int **pp_Var9;
  long lVar10;
  ulong uVar11;
  undefined8 *puVar12;
  bool bVar13;
  string transformed;
  allocator<char> local_59;
  long *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if (this->effectsOnly != false) {
    return;
  }
  uVar1 = (call->_args)._size;
  if ((ulong)uVar1 == 0) {
    return;
  }
  ppEVar2 = (call->_args)._vals;
  uVar11 = 0;
  while ((pEVar7 = deparen(ppEVar2[uVar11]), (pEVar7->super_Node)._op != TO_LITERAL ||
         (*(int *)&(pEVar7->super_Node).field_0x1c != 0))) {
    uVar11 = uVar11 + 1;
    if (uVar1 == uVar11) {
      return;
    }
  }
  pp_Var9 = pEVar7[1].super_Node.super_ArenaObj._vptr_ArenaObj;
  uVar5 = 0;
  do {
    if (*(char *)pp_Var9 == '%') {
      bVar13 = *(char *)((long)pp_Var9 + 1) != '%';
      if (!bVar13) {
        pp_Var9 = (_func_int **)((long)pp_Var9 + 1);
      }
      uVar5 = uVar5 + bVar13;
    }
    else if (*(char *)pp_Var9 == '\0') break;
    pp_Var9 = (_func_int **)((long)pp_Var9 + 1);
  } while( true );
  if (((uVar5 != 0) && (~uVar5 + uVar1 != (int)uVar11)) &&
     (__s = extractFunctionName(this,call), __s != (SQChar *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_59);
    plVar4 = local_50;
    if (local_48 != 0) {
      lVar10 = 0;
      do {
        iVar6 = tolower((int)*(char *)((long)plVar4 + lVar10));
        *(char *)((long)plVar4 + lVar10) = (char)iVar6;
        lVar10 = lVar10 + 1;
      } while (local_48 != lVar10);
    }
    puVar3 = DAT_001aa010;
    puVar12 = SQCompilationContext::format_function_name_abi_cxx11_;
    bVar13 = SQCompilationContext::format_function_name_abi_cxx11_ != DAT_001aa010;
    if (bVar13) {
      local_58 = local_50;
      pcVar8 = strstr((char *)local_50,
                      (char *)*SQCompilationContext::format_function_name_abi_cxx11_);
      local_50 = local_58;
      while (local_58 = local_50, pcVar8 == (char *)0x0) {
        puVar12 = puVar12 + 4;
        bVar13 = puVar12 != puVar3;
        if (puVar12 == puVar3) goto LAB_00153aed;
        pcVar8 = strstr((char *)local_50,(char *)*puVar12);
        local_50 = local_58;
      }
      bVar13 = true;
    }
LAB_00153aed:
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if (bVar13) {
      report(this,&(call->_args)._vals[uVar11]->super_Node,0x53);
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkFormatArguments(const CallExpr *call) {
  if (effectsOnly)
    return;

  const auto &arguments = call->arguments();

  for (int32_t i = 0; i < arguments.size(); ++i) {
    const Expr *arg = deparen(arguments[i]);
    if (arg->op() == TO_LITERAL && arg->asLiteral()->kind() == LK_STRING) { // -V522
      int32_t formatsCount = 0;
      for (const SQChar *s = arg->asLiteral()->s(); *s; ++s) {
        if (*s == '%') {
          if (*(s + 1) == '%') {
            s++;
          }
          else {
            formatsCount++;
          }
        }
      }

      if (formatsCount && formatsCount != (arguments.size() - i - 1)) {
        const SQChar *name = extractFunctionName(call);
        if (!name)
          return;

        if (nameLooksLikeFormatFunction(name)) {
          report(arguments[i], DiagnosticsId::DI_FORMAT_ARGUMENTS_COUNT);
        }
      }

      return;
    }
  }
}